

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReporterTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::reporters::Reporter_testInMemoryReporter_Test::TestBody
          (Reporter_testInMemoryReporter_Test *this)

{
  bool bVar1;
  char *pcVar2;
  int __fd;
  Message *pMVar3;
  AssertHelper local_c8 [8];
  Message local_c0 [8];
  int local_b8 [2];
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_98 [8];
  Message local_90 [28];
  int local_74;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  int i;
  int kNumReports;
  InMemoryReporter reporter;
  Reporter_testInMemoryReporter_Test *this_local;
  
  reporter._mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)this
  ;
  InMemoryReporter::InMemoryReporter((InMemoryReporter *)&i);
  gtest_ar.message_.ptr_._4_4_ = 100;
  for (gtest_ar.message_.ptr_._0_4_ = 0; (int)gtest_ar.message_.ptr_ < 100;
      gtest_ar.message_.ptr_._0_4_ = (int)gtest_ar.message_.ptr_ + 1) {
    InMemoryReporter::report((InMemoryReporter *)&i,(Span *)(anonymous_namespace)::span);
  }
  local_74 = InMemoryReporter::spansSubmitted((InMemoryReporter *)&i);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_70,"kNumReports","reporter.spansSubmitted()",
             (int *)((long)&gtest_ar.message_.ptr_ + 4),&local_74);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              (local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/reporters/ReporterTest.cpp"
               ,0x70,pcVar2);
    testing::internal::AssertHelper::operator=(local_98,local_90);
    testing::internal::AssertHelper::~AssertHelper(local_98);
    testing::Message::~Message(local_90);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    InMemoryReporter::reset((InMemoryReporter *)&i);
    local_b8[1] = 0;
    local_b8[0] = InMemoryReporter::spansSubmitted((InMemoryReporter *)&i);
    __fd = 0x344f1d;
    testing::internal::EqHelper<true>::Compare<int,int>
              (local_b0,"0",(int *)"reporter.spansSubmitted()",local_b8 + 1,local_b8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
    if (!bVar1) {
      testing::Message::Message(local_c0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
      testing::internal::AssertHelper::AssertHelper
                (local_c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/reporters/ReporterTest.cpp"
                 ,0x72,pcVar2);
      pMVar3 = local_c0;
      testing::internal::AssertHelper::operator=(local_c8,pMVar3);
      __fd = (int)pMVar3;
      testing::internal::AssertHelper::~AssertHelper(local_c8);
      testing::Message::~Message(local_c0);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      InMemoryReporter::close((InMemoryReporter *)&i,__fd);
      gtest_ar_1.message_.ptr_._4_4_ = 0;
    }
  }
  InMemoryReporter::~InMemoryReporter((InMemoryReporter *)&i);
  return;
}

Assistant:

TEST(Reporter, testInMemoryReporter)
{
    InMemoryReporter reporter;
    constexpr auto kNumReports = 100;
    for (auto i = 0; i < kNumReports; ++i) {
        reporter.report(span);
    }
    ASSERT_EQ(kNumReports, reporter.spansSubmitted());
    reporter.reset();
    ASSERT_EQ(0, reporter.spansSubmitted());
    reporter.close();
}